

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_ideal_endpoints_and_weights.cpp
# Opt level: O2

float compute_error_of_weight_set_2planes
                (endpoints_and_weights *eai1,endpoints_and_weights *eai2,decimation_info *di,
                float *dec_weight_quant_uvalue_plane1,float *dec_weight_quant_uvalue_plane2)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  uint i_2;
  ulong uVar4;
  uint i;
  ulong uVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  float fVar15;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  float fVar13;
  float fVar14;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 in_ZMM0 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  
  uVar4 = (ulong)di->texel_count;
  if (uVar4 == 0) {
    __assert_fail("texel_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                  ,0x2f9,
                  "float compute_error_of_weight_set_2planes(const endpoints_and_weights &, const endpoints_and_weights &, const decimation_info &, const float *, const float *)"
                 );
  }
  auVar20 = ZEXT1664(ZEXT816(0) << 0x40);
  if (di->max_texel_weight_count < 3) {
    if (di->max_texel_weight_count == 2) {
      uVar5 = 0;
      while( true ) {
        auVar19 = auVar20._0_16_;
        auVar8 = in_ZMM0._0_32_;
        if (uVar4 <= uVar5) break;
        bilinear_infill_vla_2(di,dec_weight_quant_uvalue_plane1,(uint)uVar5);
        auVar8 = vsubps_avx(auVar8,*(undefined1 (*) [32])(eai1->weights + uVar5));
        pfVar1 = eai1->weight_error_scale + uVar5;
        fVar6 = auVar8._0_4_ * auVar8._0_4_ * *pfVar1;
        fVar13 = auVar8._4_4_ * auVar8._4_4_ * pfVar1[1];
        auVar11._4_4_ = fVar13;
        auVar11._0_4_ = fVar6;
        fVar14 = auVar8._8_4_ * auVar8._8_4_ * pfVar1[2];
        auVar11._8_4_ = fVar14;
        fVar15 = auVar8._12_4_ * auVar8._12_4_ * pfVar1[3];
        auVar11._12_4_ = fVar15;
        fVar16 = auVar8._16_4_ * auVar8._16_4_ * pfVar1[4];
        auVar11._16_4_ = fVar16;
        fVar17 = auVar8._20_4_ * auVar8._20_4_ * pfVar1[5];
        auVar11._20_4_ = fVar17;
        fVar18 = auVar8._24_4_ * auVar8._24_4_ * pfVar1[6];
        auVar11._24_4_ = fVar18;
        auVar11._28_4_ = auVar8._28_4_;
        bilinear_infill_vla_2(di,dec_weight_quant_uvalue_plane2,(uint)uVar5);
        auVar11 = vsubps_avx(auVar11,*(undefined1 (*) [32])(eai2->weights + uVar5));
        pfVar1 = eai2->weight_error_scale + uVar5;
        auVar12._0_4_ = auVar11._0_4_ * auVar11._0_4_ * *pfVar1 + fVar6;
        auVar12._4_4_ = auVar11._4_4_ * auVar11._4_4_ * pfVar1[1] + fVar13;
        auVar12._8_4_ = auVar11._8_4_ * auVar11._8_4_ * pfVar1[2] + fVar14;
        auVar12._12_4_ = auVar11._12_4_ * auVar11._12_4_ * pfVar1[3] + fVar15;
        auVar12._16_4_ = auVar11._16_4_ * auVar11._16_4_ * pfVar1[4] + fVar16;
        auVar12._20_4_ = auVar11._20_4_ * auVar11._20_4_ * pfVar1[5] + fVar17;
        auVar12._24_4_ = auVar11._24_4_ * auVar11._24_4_ * pfVar1[6] + fVar18;
        auVar12._28_4_ = auVar11._28_4_ + auVar8._28_4_;
        local_68 = auVar20._0_4_;
        fStack_64 = auVar20._4_4_;
        fStack_60 = auVar20._8_4_;
        fStack_5c = auVar20._12_4_;
        in_ZMM0 = ZEXT1664(auVar12._16_16_);
        auVar20 = ZEXT1664(CONCAT412(auVar12._28_4_ + auVar12._12_4_ + fStack_5c,
                                     CONCAT48(auVar12._24_4_ + auVar12._8_4_ + fStack_60,
                                              CONCAT44(auVar12._20_4_ + auVar12._4_4_ + fStack_64,
                                                       auVar12._16_4_ + auVar12._0_4_ + local_68))))
        ;
        uVar5 = uVar5 + 8;
      }
    }
    else {
      for (uVar5 = 0; auVar19 = auVar20._0_16_, uVar5 < uVar4; uVar5 = uVar5 + 8) {
        auVar8 = vsubps_avx(*(undefined1 (*) [32])(dec_weight_quant_uvalue_plane1 + uVar5),
                            *(undefined1 (*) [32])(eai1->weights + uVar5));
        pfVar1 = eai1->weight_error_scale + uVar5;
        auVar11 = vsubps_avx(*(undefined1 (*) [32])(dec_weight_quant_uvalue_plane2 + uVar5),
                             *(undefined1 (*) [32])(eai2->weights + uVar5));
        pfVar2 = eai2->weight_error_scale + uVar5;
        fVar6 = auVar8._4_4_ * auVar8._4_4_ * pfVar1[1] + auVar11._4_4_ * auVar11._4_4_ * pfVar2[1];
        auVar20 = ZEXT1664(CONCAT412(auVar8._28_4_ + auVar11._28_4_ +
                                     auVar20._12_4_ +
                                     auVar8._12_4_ * auVar8._12_4_ * pfVar1[3] +
                                     auVar11._12_4_ * auVar11._12_4_ * pfVar2[3],
                                     CONCAT48(auVar8._24_4_ * auVar8._24_4_ * pfVar1[6] +
                                              auVar11._24_4_ * auVar11._24_4_ * pfVar2[6] +
                                              auVar20._8_4_ +
                                              auVar8._8_4_ * auVar8._8_4_ * pfVar1[2] +
                                              auVar11._8_4_ * auVar11._8_4_ * pfVar2[2],
                                              CONCAT44(fVar6 + auVar20._4_4_ + fVar6,
                                                       auVar8._16_4_ * auVar8._16_4_ * pfVar1[4] +
                                                       auVar11._16_4_ * auVar11._16_4_ * pfVar2[4] +
                                                       auVar20._0_4_ +
                                                       auVar8._0_4_ * auVar8._0_4_ * *pfVar1 +
                                                       auVar11._0_4_ * auVar11._0_4_ * *pfVar2))));
      }
    }
  }
  else {
    uVar5 = 0;
    while( true ) {
      auVar19 = auVar20._0_16_;
      auVar8 = in_ZMM0._0_32_;
      if (uVar4 <= uVar5) break;
      bilinear_infill_vla(di,dec_weight_quant_uvalue_plane1,(uint)uVar5);
      auVar8 = vsubps_avx(auVar8,*(undefined1 (*) [32])(eai1->weights + uVar5));
      pfVar1 = eai1->weight_error_scale + uVar5;
      fVar6 = auVar8._0_4_ * auVar8._0_4_ * *pfVar1;
      fVar13 = auVar8._4_4_ * auVar8._4_4_ * pfVar1[1];
      auVar9._4_4_ = fVar13;
      auVar9._0_4_ = fVar6;
      fVar14 = auVar8._8_4_ * auVar8._8_4_ * pfVar1[2];
      auVar9._8_4_ = fVar14;
      fVar15 = auVar8._12_4_ * auVar8._12_4_ * pfVar1[3];
      auVar9._12_4_ = fVar15;
      fVar16 = auVar8._16_4_ * auVar8._16_4_ * pfVar1[4];
      auVar9._16_4_ = fVar16;
      fVar17 = auVar8._20_4_ * auVar8._20_4_ * pfVar1[5];
      auVar9._20_4_ = fVar17;
      fVar18 = auVar8._24_4_ * auVar8._24_4_ * pfVar1[6];
      auVar9._24_4_ = fVar18;
      auVar9._28_4_ = auVar8._28_4_;
      bilinear_infill_vla(di,dec_weight_quant_uvalue_plane2,(uint)uVar5);
      auVar11 = vsubps_avx(auVar9,*(undefined1 (*) [32])(eai2->weights + uVar5));
      pfVar1 = eai2->weight_error_scale + uVar5;
      auVar10._0_4_ = auVar11._0_4_ * auVar11._0_4_ * *pfVar1 + fVar6;
      auVar10._4_4_ = auVar11._4_4_ * auVar11._4_4_ * pfVar1[1] + fVar13;
      auVar10._8_4_ = auVar11._8_4_ * auVar11._8_4_ * pfVar1[2] + fVar14;
      auVar10._12_4_ = auVar11._12_4_ * auVar11._12_4_ * pfVar1[3] + fVar15;
      auVar10._16_4_ = auVar11._16_4_ * auVar11._16_4_ * pfVar1[4] + fVar16;
      auVar10._20_4_ = auVar11._20_4_ * auVar11._20_4_ * pfVar1[5] + fVar17;
      auVar10._24_4_ = auVar11._24_4_ * auVar11._24_4_ * pfVar1[6] + fVar18;
      auVar10._28_4_ = auVar11._28_4_ + auVar8._28_4_;
      local_68 = auVar20._0_4_;
      fStack_64 = auVar20._4_4_;
      fStack_60 = auVar20._8_4_;
      fStack_5c = auVar20._12_4_;
      in_ZMM0 = ZEXT1664(auVar10._16_16_);
      auVar20 = ZEXT1664(CONCAT412(auVar10._28_4_ + auVar10._12_4_ + fStack_5c,
                                   CONCAT48(auVar10._24_4_ + auVar10._8_4_ + fStack_60,
                                            CONCAT44(auVar10._20_4_ + auVar10._4_4_ + fStack_64,
                                                     auVar10._16_4_ + auVar10._0_4_ + local_68))));
      uVar5 = uVar5 + 8;
    }
  }
  auVar3 = vshufpd_avx(auVar19,auVar19,1);
  auVar7._0_4_ = auVar19._0_4_ + auVar3._0_4_;
  auVar7._4_4_ = auVar19._4_4_ + auVar3._4_4_;
  auVar7._8_4_ = auVar19._8_4_ + auVar3._8_4_;
  auVar7._12_4_ = auVar19._12_4_ + auVar3._12_4_;
  auVar19 = vhaddps_avx(auVar7,auVar7);
  return auVar19._0_4_;
}

Assistant:

float compute_error_of_weight_set_2planes(
	const endpoints_and_weights& eai1,
	const endpoints_and_weights& eai2,
	const decimation_info& di,
	const float* dec_weight_quant_uvalue_plane1,
	const float* dec_weight_quant_uvalue_plane2
) {
	vfloatacc error_summav = vfloatacc::zero();
	unsigned int texel_count = di.texel_count;
	promise(texel_count > 0);

	// Process SIMD-width chunks, safe to over-fetch - the extra space is zero initialized
	if (di.max_texel_weight_count > 2)
	{
		for (unsigned int i = 0; i < texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			// Plane 1
			// Compute the bilinear interpolation of the decimated weight grid
			vfloat current_values1 = bilinear_infill_vla(di, dec_weight_quant_uvalue_plane1, i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values1 = loada(eai1.weights + i);
			vfloat diff = current_values1 - actual_values1;
			vfloat error1 = diff * diff * loada(eai1.weight_error_scale + i);

			// Plane 2
			// Compute the bilinear interpolation of the decimated weight grid
			vfloat current_values2 = bilinear_infill_vla(di, dec_weight_quant_uvalue_plane2, i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values2 = loada(eai2.weights + i);
			diff = current_values2 - actual_values2;
			vfloat error2 = diff * diff * loada(eai2.weight_error_scale + i);

			haccumulate(error_summav, error1 + error2);
		}
	}
	else if (di.max_texel_weight_count > 1)
	{
		for (unsigned int i = 0; i < texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			// Plane 1
			// Compute the bilinear interpolation of the decimated weight grid
			vfloat current_values1 = bilinear_infill_vla_2(di, dec_weight_quant_uvalue_plane1, i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values1 = loada(eai1.weights + i);
			vfloat diff = current_values1 - actual_values1;
			vfloat error1 = diff * diff * loada(eai1.weight_error_scale + i);

			// Plane 2
			// Compute the bilinear interpolation of the decimated weight grid
			vfloat current_values2 = bilinear_infill_vla_2(di, dec_weight_quant_uvalue_plane2, i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values2 = loada(eai2.weights + i);
			diff = current_values2 - actual_values2;
			vfloat error2 = diff * diff * loada(eai2.weight_error_scale + i);

			haccumulate(error_summav, error1 + error2);
		}
	}
	else
	{
		for (unsigned int i = 0; i < texel_count; i += ASTCENC_SIMD_WIDTH)
		{
			// Plane 1
			// Load the weight set directly, without interpolation
			vfloat current_values1 = loada(dec_weight_quant_uvalue_plane1 + i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values1 = loada(eai1.weights + i);
			vfloat diff = current_values1 - actual_values1;
			vfloat error1 = diff * diff * loada(eai1.weight_error_scale + i);

			// Plane 2
			// Load the weight set directly, without interpolation
			vfloat current_values2 = loada(dec_weight_quant_uvalue_plane2 + i);

			// Compute the error between the computed value and the ideal weight
			vfloat actual_values2 = loada(eai2.weights + i);
			diff = current_values2 - actual_values2;
			vfloat error2 = diff * diff * loada(eai2.weight_error_scale + i);

			haccumulate(error_summav, error1 + error2);
		}
	}

	// Resolve the final scalar accumulator sum
	return hadd_s(error_summav);
}